

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CESkyCoord.cpp
# Opt level: O0

bool __thiscall test_CESkyCoord::test_Convert2Icrs(test_CESkyCoord *this)

{
  byte bVar1;
  long *in_RDI;
  CESkyCoord ecl2icrs;
  CESkyCoord obs2icrs;
  CESkyCoord gal2icrs;
  CESkyCoord icrs2icrs;
  CESkyCoord cirs2icrs;
  CEObserver *in_stack_fffffffffffff970;
  CESkyCoord *pCVar2;
  undefined8 in_stack_fffffffffffff980;
  CEDateType date_format;
  long *plVar3;
  double in_stack_fffffffffffff988;
  allocator *paVar4;
  CEDate *in_stack_fffffffffffff990;
  CEObserver *in_stack_fffffffffffff998;
  CEObserver *observer;
  CEObserver *in_stack_fffffffffffff9a0;
  CEObserver *this_00;
  CEObserver *in_stack_fffffffffffff9a8;
  CEDate *date;
  CESkyCoord *in_observed;
  undefined4 local_5b0;
  allocator local_5a9;
  string local_5a8 [32];
  undefined4 local_588;
  allocator local_581;
  string local_580 [8];
  CESkyCoord *in_stack_fffffffffffffa88;
  CESkyCoord *in_stack_fffffffffffffa90;
  CEDate *in_stack_fffffffffffffaa0;
  CESkyCoord *in_stack_fffffffffffffaa8;
  CEDate *in_stack_fffffffffffffab0;
  CESkyCoord *in_stack_fffffffffffffab8;
  CESkyCoord *in_stack_fffffffffffffac0;
  undefined1 local_4b0 [48];
  undefined4 local_480;
  undefined1 local_479 [33];
  undefined4 local_458;
  undefined1 local_451 [33];
  undefined1 local_430 [48];
  undefined4 local_400;
  allocator local_3f9;
  string local_3f8 [32];
  undefined4 local_3d8;
  allocator local_3d1;
  string local_3d0 [272];
  undefined1 local_2c0 [48];
  undefined4 local_290;
  allocator local_289;
  string local_288 [272];
  undefined1 local_178 [48];
  undefined4 local_148;
  allocator local_141;
  string local_140 [32];
  undefined4 local_120;
  allocator local_119;
  string local_118 [224];
  undefined1 local_38 [56];
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffff980 >> 0x20);
  CEObserver::CEObserver(in_stack_fffffffffffff9a0);
  CESkyCoord::ConvertToICRS
            ((CESkyCoord *)in_stack_fffffffffffff9a8,(CEDate *)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998);
  CEObserver::~CEObserver(in_stack_fffffffffffff970);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"test_Convert2Icrs",&local_119);
  local_120 = 0xe4;
  (**(code **)(*in_RDI + 200))(in_RDI,local_38,in_RDI + 0x4a,local_118,&local_120);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  CESkyCoord::CIRS2ICRS
            ((CESkyCoord *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
             in_stack_fffffffffffffaa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"test_Convert2Icrs",&local_141);
  local_148 = 0xe7;
  (**(code **)(*in_RDI + 200))(in_RDI,local_38,in_RDI + 0x4a,local_140,&local_148);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  CEDate::CurrentJD();
  CEDate::CEDate(in_stack_fffffffffffff990,in_stack_fffffffffffff988,date_format);
  CEObserver::CEObserver(in_stack_fffffffffffff9a0);
  CESkyCoord::ConvertToICRS
            ((CESkyCoord *)in_stack_fffffffffffff9a8,(CEDate *)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998);
  CEObserver::~CEObserver(in_stack_fffffffffffff970);
  CEDate::~CEDate((CEDate *)0x1209e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"test_Convert2Icrs",&local_289);
  local_290 = 0xeb;
  (**(code **)(*in_RDI + 200))(in_RDI,local_178,in_RDI + 0x4a,local_288,&local_290);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  CEDate::CurrentJD();
  CEDate::CEDate(in_stack_fffffffffffff990,in_stack_fffffffffffff988,date_format);
  CEObserver::CEObserver(in_stack_fffffffffffff9a0);
  CESkyCoord::ConvertToICRS
            ((CESkyCoord *)in_stack_fffffffffffff9a8,(CEDate *)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998);
  CEObserver::~CEObserver(in_stack_fffffffffffff970);
  CEDate::~CEDate((CEDate *)0x120b16);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"test_Convert2Icrs",&local_3d1);
  local_3d8 = 0xef;
  (**(code **)(*in_RDI + 200))(in_RDI,local_2c0,in_RDI + 0x4a,local_3d0,&local_3d8);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  CESkyCoord::Galactic2ICRS(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  in_observed = (CESkyCoord *)(in_RDI + 0x4a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"test_Convert2Icrs",&local_3f9);
  local_400 = 0xf2;
  (**(code **)(*in_RDI + 200))(in_RDI,local_2c0,in_observed,local_3f8,&local_400);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  CESkyCoord::ConvertToICRS
            ((CESkyCoord *)in_stack_fffffffffffff9a8,(CEDate *)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998);
  date = (CEDate *)(in_RDI + 0x4a);
  pCVar2 = (CESkyCoord *)local_451;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_451 + 1),"test_Convert2Icrs",(allocator *)pCVar2);
  local_458 = 0xf6;
  (**(code **)(*in_RDI + 200))(in_RDI,local_430,date,local_451 + 1,&local_458);
  std::__cxx11::string::~string((string *)(local_451 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_451);
  CESkyCoord::Observed2ICRS(in_observed,pCVar2,date,in_stack_fffffffffffff9a8);
  this_00 = (CEObserver *)(in_RDI + 0x4a);
  pCVar2 = (CESkyCoord *)local_479;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_479 + 1),"test_Convert2Icrs",(allocator *)pCVar2);
  local_480 = 0xf9;
  (**(code **)(*in_RDI + 200))(in_RDI,local_430,this_00,local_479 + 1,&local_480);
  std::__cxx11::string::~string((string *)(local_479 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_479);
  observer = (CEObserver *)(in_RDI + 0x62);
  CEObserver::CEObserver(this_00);
  CESkyCoord::ConvertToICRS(pCVar2,(CEDate *)this_00,observer);
  CEObserver::~CEObserver(in_stack_fffffffffffff970);
  plVar3 = in_RDI + 0x4a;
  paVar4 = &local_581;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"test_Convert2Icrs",paVar4);
  local_588 = 0xfd;
  (**(code **)(*in_RDI + 200))(in_RDI,local_4b0,plVar3,local_580,&local_588);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  CESkyCoord::Ecliptic2ICRS
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  pCVar2 = (CESkyCoord *)(in_RDI + 0x4a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a8,"test_Convert2Icrs",&local_5a9);
  local_5b0 = 0x100;
  (**(code **)(*in_RDI + 200))(in_RDI,local_4b0,pCVar2,local_5a8,&local_5b0);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  CESkyCoord::~CESkyCoord(pCVar2);
  CESkyCoord::~CESkyCoord(pCVar2);
  CESkyCoord::~CESkyCoord(pCVar2);
  CESkyCoord::~CESkyCoord(pCVar2);
  CESkyCoord::~CESkyCoord(pCVar2);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CESkyCoord::test_Convert2Icrs()
{
    // CIRS -> ICRS
    CESkyCoord cirs2icrs = base_cirs_.ConvertToICRS(base_date_);
    test_coords(cirs2icrs, base_icrs_, __func__, __LINE__);

    CESkyCoord::CIRS2ICRS(base_cirs_, &cirs2icrs, base_date_);
    test_coords(cirs2icrs, base_icrs_, __func__, __LINE__);
    
    // ICRS -> ICRS
    CESkyCoord icrs2icrs = base_icrs_.ConvertToICRS();
    test_coords(icrs2icrs, base_icrs_, __func__, __LINE__);

    // Galactic -> ICRS
    CESkyCoord gal2icrs = base_gal_.ConvertToICRS();
    test_coords(gal2icrs, base_icrs_, __func__, __LINE__);

    CESkyCoord::Galactic2ICRS(base_gal_, &gal2icrs);
    test_coords(gal2icrs, base_icrs_, __func__, __LINE__);

    // Observed -> ICRS
    CESkyCoord obs2icrs = base_obs_.ConvertToICRS(base_date_, base_observer_);
    test_coords(obs2icrs, base_icrs_, __func__, __LINE__);

    CESkyCoord::Observed2ICRS(base_obs_, &obs2icrs, base_date_, base_observer_);
    test_coords(obs2icrs, base_icrs_, __func__, __LINE__);

    // Ecliptic -> ICRS
    CESkyCoord ecl2icrs = base_ecl_.ConvertToICRS(base_date_);
    test_coords(ecl2icrs, base_icrs_, __func__, __LINE__);

    CESkyCoord::Ecliptic2ICRS(base_ecl_, &ecl2icrs, base_date_);
    test_coords(ecl2icrs, base_icrs_, __func__, __LINE__);

    return pass();
}